

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O3

void __thiscall
aeron::archive::ChannelUri::ChannelUri(ChannelUri *this,string *media,ParamsMap *params)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  ChannelUri(this,&local_48,media,params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ChannelUri::ChannelUri(const std::string& media, ParamsMap&& params)
    : ChannelUri("", media, std::move(params)) {}